

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,InstanceSymbol *symbol)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  PortConnection *this_00;
  ulong uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  Diagnostic *pDVar7;
  DefinitionSymbol *this_01;
  value_type *elements;
  ulong pos0;
  long lVar8;
  ulong hash;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> sVar17;
  string_view sVar18;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  TimeTraceScope timeScope;
  InstanceBodySymbol *local_68;
  undefined1 local_60 [16];
  bool local_50;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  if (((*this->numErrors <= (ulong)this->errorLimit) && ((this->hierarchyProblem & 1U) == 0)) &&
     ((this->visitInstances != false || (((symbol->body->flags).m_bits & 2) == 0)))) {
    detail.callable = (intptr_t)local_60;
    detail.callback =
         function_ref<std::__cxx11::string()>::
         callback_fn<slang::ast::DiagnosticVisitor::handle(slang::ast::InstanceSymbol_const&)::_lambda()_1_>
    ;
    sVar18._M_str = "AST Instance";
    sVar18._M_len = 0xc;
    local_60._0_8_ = symbol;
    TimeTraceScope::TimeTraceScope(&timeScope,sVar18,detail);
    sVar17 = InstanceSymbol::getPortConnections(symbol);
    for (lVar8 = 0; sVar17._M_extent._M_extent_value._M_extent_value << 3 != lVar8;
        lVar8 = lVar8 + 8) {
      this_00 = *(PortConnection **)((long)sVar17._M_ptr + lVar8);
      PortConnection::getExpression(this_00);
      PortConnection::checkSimulatedNetTypes(this_00);
    }
    local_68 = symbol->body;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_68;
    hash = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->activeInstanceBodies).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
                          .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    uVar3 = (this->activeInstanceBodies).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
            .arrays.groups_size_mask;
    uVar10 = 0;
    uVar11 = pos0;
    do {
      pgVar1 = (this->activeInstanceBodies).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
               .arrays.groups_ + uVar11;
      local_48 = pgVar1->m[0].n;
      uStack_47 = pgVar1->m[1].n;
      uStack_46 = pgVar1->m[2].n;
      bStack_45 = pgVar1->m[3].n;
      uStack_44 = pgVar1->m[4].n;
      uStack_43 = pgVar1->m[5].n;
      uStack_42 = pgVar1->m[6].n;
      bStack_41 = pgVar1->m[7].n;
      uStack_40 = pgVar1->m[8].n;
      uStack_3f = pgVar1->m[9].n;
      uStack_3e = pgVar1->m[10].n;
      bStack_3d = pgVar1->m[0xb].n;
      uStack_3c = pgVar1->m[0xc].n;
      uStack_3b = pgVar1->m[0xd].n;
      uStack_3a = pgVar1->m[0xe].n;
      bStack_39 = pgVar1->m[0xf].n;
      uVar12 = (uchar)uVar2;
      auVar16[0] = -(local_48 == uVar12);
      uVar13 = (uchar)((uint)uVar2 >> 8);
      auVar16[1] = -(uStack_47 == uVar13);
      uVar14 = (uchar)((uint)uVar2 >> 0x10);
      auVar16[2] = -(uStack_46 == uVar14);
      bVar15 = (byte)((uint)uVar2 >> 0x18);
      auVar16[3] = -(bStack_45 == bVar15);
      auVar16[4] = -(uStack_44 == uVar12);
      auVar16[5] = -(uStack_43 == uVar13);
      auVar16[6] = -(uStack_42 == uVar14);
      auVar16[7] = -(bStack_41 == bVar15);
      auVar16[8] = -(uStack_40 == uVar12);
      auVar16[9] = -(uStack_3f == uVar13);
      auVar16[10] = -(uStack_3e == uVar14);
      auVar16[0xb] = -(bStack_3d == bVar15);
      auVar16[0xc] = -(uStack_3c == uVar12);
      auVar16[0xd] = -(uStack_3b == uVar13);
      auVar16[0xe] = -(uStack_3a == uVar14);
      auVar16[0xf] = -(bStack_39 == bVar15);
      for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe); uVar9 != 0;
          uVar9 = uVar9 - 1 & uVar9) {
        uVar4 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        if (local_68 ==
            (this->activeInstanceBodies).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
            .arrays.elements_[uVar11 * 0xf + (ulong)uVar4]) {
          pDVar7 = Scope::addDiag((symbol->super_InstanceSymbolBase).super_Symbol.parentScope,
                                  (DiagCode)0x24000d,
                                  (symbol->super_InstanceSymbolBase).super_Symbol.location);
          Diagnostic::operator<<(pDVar7,(symbol->super_InstanceSymbolBase).super_Symbol.name);
          this->hierarchyProblem = true;
          goto LAB_002b87a7;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0) break;
      lVar8 = uVar11 + uVar10;
      uVar10 = uVar10 + 1;
      uVar11 = lVar8 + 1U & uVar3;
    } while (uVar10 <= uVar3);
    if ((this->activeInstanceBodies).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
        .size_ctrl.size <
        (this->activeInstanceBodies).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
      ::unchecked_emplace_at<slang::ast::InstanceBodySymbol_const*>
                ((locator *)local_60,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
                  *)&this->activeInstanceBodies,pos0,hash,&local_68);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
      ::unchecked_emplace_with_rehash<slang::ast::InstanceBodySymbol_const*>
                ((locator *)local_60,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::InstanceBodySymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::InstanceBodySymbol_const*,void>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,std::allocator<slang::ast::InstanceBodySymbol_const*>>
                  *)&this->activeInstanceBodies,hash,&local_68);
    }
    local_50 = true;
    local_60._0_8_ = this;
    local_60._8_8_ = symbol;
    if ((ulong)(this->compilation->options).maxInstanceDepth <
        (this->activeInstanceBodies).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
        .size_ctrl.size) {
      pDVar7 = Scope::addDiag((symbol->super_InstanceSymbolBase).super_Symbol.parentScope,
                              (DiagCode)0x25000d,
                              (symbol->super_InstanceSymbolBase).super_Symbol.location);
      this_01 = InstanceSymbol::getDefinition(symbol);
      sVar18 = DefinitionSymbol::getKindString(this_01);
      Diagnostic::operator<<(pDVar7,sVar18);
      Diagnostic::operator<<<unsigned_int>(pDVar7,(this->compilation->options).maxInstanceDepth);
      this->hierarchyProblem = true;
    }
    else if ((this->visitInstances == true) && (bVar6 = tryApplyFromCache(this,symbol), !bVar6)) {
      handleDefault<slang::ast::InstanceBodySymbol>(this,symbol->body);
    }
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/ElabVisitors.h:369:33)>
    ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_ElabVisitors_h:369:33)>
                   *)local_60);
LAB_002b87a7:
    TimeTraceScope::~TimeTraceScope(&timeScope);
  }
  return;
}

Assistant:

bool finishedEarly() const { return numErrors > errorLimit || hierarchyProblem; }